

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_resize(ZSTDMT_CCtx *mtctx,uint nbWorkers)

{
  int iVar1;
  uint uVar2;
  ZSTDMT_bufferPool *pZVar3;
  ZSTDMT_CCtxPool *pZVar4;
  ZSTDMT_seqPool *pZVar5;
  size_t err_code;
  uint nbWorkers_local;
  ZSTDMT_CCtx *mtctx_local;
  
  iVar1 = POOL_resize(mtctx->factory,(ulong)nbWorkers);
  if (iVar1 == 0) {
    mtctx_local = (ZSTDMT_CCtx *)ZSTDMT_expandJobsTable(mtctx,nbWorkers);
    uVar2 = ERR_isError((size_t)mtctx_local);
    if (uVar2 == 0) {
      pZVar3 = ZSTDMT_expandBufferPool(mtctx->bufPool,nbWorkers);
      mtctx->bufPool = pZVar3;
      if (mtctx->bufPool == (ZSTDMT_bufferPool *)0x0) {
        mtctx_local = (ZSTDMT_CCtx *)0xffffffffffffffc0;
      }
      else {
        pZVar4 = ZSTDMT_expandCCtxPool(mtctx->cctxPool,nbWorkers);
        mtctx->cctxPool = pZVar4;
        if (mtctx->cctxPool == (ZSTDMT_CCtxPool *)0x0) {
          mtctx_local = (ZSTDMT_CCtx *)0xffffffffffffffc0;
        }
        else {
          pZVar5 = ZSTDMT_expandSeqPool(mtctx->seqPool,nbWorkers);
          mtctx->seqPool = pZVar5;
          if (mtctx->seqPool == (ZSTDMT_seqPool *)0x0) {
            mtctx_local = (ZSTDMT_CCtx *)0xffffffffffffffc0;
          }
          else {
            ZSTDMT_CCtxParam_setNbWorkers(&mtctx->params,nbWorkers);
            mtctx_local = (ZSTDMT_CCtx *)0x0;
          }
        }
      }
    }
  }
  else {
    mtctx_local = (ZSTDMT_CCtx *)0xffffffffffffffc0;
  }
  return (size_t)mtctx_local;
}

Assistant:

static size_t ZSTDMT_resize(ZSTDMT_CCtx* mtctx, unsigned nbWorkers)
{
    if (POOL_resize(mtctx->factory, nbWorkers)) return ERROR(memory_allocation);
    FORWARD_IF_ERROR( ZSTDMT_expandJobsTable(mtctx, nbWorkers) );
    mtctx->bufPool = ZSTDMT_expandBufferPool(mtctx->bufPool, nbWorkers);
    if (mtctx->bufPool == NULL) return ERROR(memory_allocation);
    mtctx->cctxPool = ZSTDMT_expandCCtxPool(mtctx->cctxPool, nbWorkers);
    if (mtctx->cctxPool == NULL) return ERROR(memory_allocation);
    mtctx->seqPool = ZSTDMT_expandSeqPool(mtctx->seqPool, nbWorkers);
    if (mtctx->seqPool == NULL) return ERROR(memory_allocation);
    ZSTDMT_CCtxParam_setNbWorkers(&mtctx->params, nbWorkers);
    return 0;
}